

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::autoCompleteFileName(QFileDialogPrivate *this,QString *text)

{
  QAbstractProxyModel *pQVar1;
  char cVar2;
  bool bVar3;
  difference_type dVar4;
  QModelIndex *pQVar5;
  QItemSelectionModel *pQVar6;
  long lVar7;
  QString *file;
  QModelIndex *pQVar8;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QModelIndex idx;
  QModelIndex local_d8;
  QList<QModelIndex> local_b8;
  QList<QModelIndex> local_98;
  QArrayDataPointer<QString> local_78;
  QModelIndex local_58;
  anon_class_8_1_54a39814_for__M_pred_conflict1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9.m_data = (char *)0x2;
  QVar9.m_size = (qsizetype)text;
  cVar2 = QString::startsWith(QVar9,0x66fb90);
  if (cVar2 == '\0') {
    cVar2 = QString::startsWith((QChar)(char16_t)text,0x5c);
    if (cVar2 == '\0') {
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      typedFiles((QStringList *)&local_78,this);
      if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
        local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
        QItemSelectionModel::selectedRows((int)&local_98);
        local_b8.d.d = (Data *)0x0;
        local_b8.d.ptr = (QModelIndex *)0x0;
        local_b8.d.size = 0;
        if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
          lVar7 = local_78.size * 0x18;
          do {
            local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_d8.r = -0x55555556;
            local_d8.c = -0x55555556;
            local_d8.i._0_4_ = 0xaaaaaaaa;
            local_d8.i._4_4_ = 0xaaaaaaaa;
            QFileSystemModel::index((QString *)&local_d8,(int)this->model);
            local_58.m.ptr = local_d8.m.ptr;
            local_58._0_8_ = CONCAT44(local_d8.c,local_d8.r);
            local_58.i = CONCAT44(local_d8.i._4_4_,(undefined4)local_d8.i);
            local_40.t = &local_58;
            dVar4 = QtPrivate::
                    sequential_erase_if<QList<QModelIndex>,QtPrivate::sequential_erase<QList<QModelIndex>,QModelIndex>(QList<QModelIndex>&,QModelIndex_const&)::_lambda(auto:1_const&)_1_>
                              (&local_98,&local_40);
            if (dVar4 == 0) {
              QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                        ((QMovableArrayOps<QModelIndex> *)&local_b8,local_b8.d.size,&local_d8);
              QList<QModelIndex>::end(&local_b8);
            }
            lVar7 = lVar7 + -0x18;
          } while (lVar7 != 0);
        }
        if (local_b8.d.size != 0) {
          lVar7 = local_b8.d.size * 0x18;
          pQVar8 = local_b8.d.ptr;
          do {
            local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            pQVar1 = this->proxyModel;
            if (pQVar1 == (QAbstractProxyModel *)0x0) {
              local_58.m.ptr = (pQVar8->m).ptr;
              local_58._0_8_ = *(undefined8 *)pQVar8;
              local_58.i = pQVar8->i;
            }
            else {
              (**(code **)(*(long *)pQVar1 + 0x198))(&local_58,pQVar1,pQVar8);
            }
            if (((-1 < local_58.r) && (-1 < (long)local_58._0_8_)) &&
               (local_58.m.ptr != (QAbstractItemModel *)0x0)) {
              pQVar5 = (QModelIndex *)
                       QAbstractItemView::selectionModel
                                 ((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
              cVar2 = QItemSelectionModel::isSelected(pQVar5);
              if (cVar2 == '\0') {
                pQVar6 = QAbstractItemView::selectionModel
                                   ((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
                (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,&local_58,0x22);
              }
            }
            pQVar8 = pQVar8 + 1;
            lVar7 = lVar7 + -0x18;
          } while (lVar7 != 0);
        }
        bVar3 = QWidget::hasFocus((QWidget *)((this->qFileDialogUi).d)->fileNameEdit);
        if (bVar3) {
          pQVar6 = QAbstractItemView::selectionModel
                             ((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
          if ((undefined1 *)local_98.d.size != (undefined1 *)0x0) {
            lVar7 = local_98.d.size * 0x18;
            pQVar8 = local_98.d.ptr;
            do {
              (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,pQVar8,0x28);
              pQVar8 = pQVar8 + 1;
              lVar7 = lVar7 + -0x18;
            } while (lVar7 != 0);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,0x18,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,0x18,0x10);
          }
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_004f254c;
    }
  }
  QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QItemSelectionModel::clearSelection();
    return;
  }
LAB_004f254c:
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::autoCompleteFileName(const QString &text)
{
    if (text.startsWith("//"_L1) || text.startsWith(u'\\')) {
        qFileDialogUi->listView->selectionModel()->clearSelection();
        return;
    }

    const QStringList multipleFiles = typedFiles();
    if (multipleFiles.size() > 0) {
        QModelIndexList oldFiles = qFileDialogUi->listView->selectionModel()->selectedRows();
        QList<QModelIndex> newFiles;
        for (const auto &file : multipleFiles) {
            QModelIndex idx = model->index(file);
            if (oldFiles.removeAll(idx) == 0)
                newFiles.append(idx);
        }
        for (const auto &newFile : std::as_const(newFiles))
            select(newFile);
        if (lineEdit()->hasFocus()) {
            auto *sm = qFileDialogUi->listView->selectionModel();
            for (const auto &oldFile : std::as_const(oldFiles))
                sm->select(oldFile, QItemSelectionModel::Toggle | QItemSelectionModel::Rows);
        }
    }
}